

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsitem.cpp
# Opt level: O1

QTransform * __thiscall
QGraphicsItem::itemTransform
          (QTransform *__return_storage_ptr__,QGraphicsItem *this,QGraphicsItem *other,bool *ok)

{
  QGraphicsItemPrivate *pQVar1;
  QGraphicsItemPrivate *this_00;
  bool bVar2;
  QGraphicsItem *pQVar3;
  long lVar4;
  qreal *pqVar5;
  QTransform *pQVar6;
  qreal *pqVar7;
  QTransform *pQVar8;
  long in_FS_OFFSET;
  byte bVar9;
  double dVar10;
  double dVar11;
  bool good;
  QTransform otherToParent_1;
  QTransform x;
  bool local_129;
  QTransform local_128;
  QTransform local_d8;
  QTransform local_88;
  long local_38;
  
  bVar9 = 0;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (other == (QGraphicsItem *)0x0) {
    itemTransform();
  }
  else if (other == this) {
    if (ok != (bool *)0x0) {
      *ok = true;
    }
LAB_005eb419:
    pqVar5 = (qreal *)&DAT_00700e28;
    pQVar6 = __return_storage_ptr__;
    for (lVar4 = 9; lVar4 != 0; lVar4 = lVar4 + -1) {
      pQVar6->m_matrix[0][0] = *pqVar5;
      pqVar5 = pqVar5 + (ulong)bVar9 * -2 + 1;
      pQVar6 = (QTransform *)((long)pQVar6 + ((ulong)bVar9 * -2 + 1) * 8);
    }
    *(ushort *)&__return_storage_ptr__->field_0x48 =
         *(ushort *)&__return_storage_ptr__->field_0x48 & 0xfc00;
  }
  else {
    pQVar1 = (this->d_ptr).d;
    if (pQVar1->parent == other) {
      if (ok != (bool *)0x0) {
        *ok = true;
      }
      pqVar5 = (qreal *)&DAT_00700eb8;
      pqVar7 = (qreal *)__return_storage_ptr__;
      for (lVar4 = 10; lVar4 != 0; lVar4 = lVar4 + -1) {
        *pqVar7 = *pqVar5;
        pqVar5 = pqVar5 + 1;
        pqVar7 = pqVar7 + 1;
      }
      pqVar5 = (qreal *)&DAT_00700e28;
      pqVar7 = (qreal *)__return_storage_ptr__;
      for (lVar4 = 9; lVar4 != 0; lVar4 = lVar4 + -1) {
        *pqVar7 = *pqVar5;
        pqVar5 = pqVar5 + 1;
        pqVar7 = pqVar7 + 1;
      }
      *(ushort *)&__return_storage_ptr__->field_0x48 =
           *(ushort *)&__return_storage_ptr__->field_0x48 & 0xfc00;
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        QGraphicsItemPrivate::combineTransformFromParent
                  (pQVar1,__return_storage_ptr__,(QTransform *)0x0);
        return __return_storage_ptr__;
      }
      goto LAB_005eb76b;
    }
    this_00 = (other->d_ptr).d;
    if (this_00->parent == this) {
      if (this_00->transformData == (TransformData *)0x0) {
        if (ok != (bool *)0x0) {
          *ok = true;
        }
        if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
          dVar10 = -(this_00->pos).xp;
          dVar11 = -(this_00->pos).yp;
LAB_005eb649:
          QTransform::fromTranslate(dVar10,dVar11);
          return __return_storage_ptr__;
        }
        goto LAB_005eb76b;
      }
      pqVar5 = (qreal *)&DAT_00700eb8;
      pqVar7 = (qreal *)&local_88;
      for (lVar4 = 10; lVar4 != 0; lVar4 = lVar4 + -1) {
        *pqVar7 = *pqVar5;
        pqVar5 = pqVar5 + 1;
        pqVar7 = pqVar7 + 1;
      }
      pqVar5 = (qreal *)&DAT_00700e28;
      pqVar7 = (qreal *)&local_88;
      for (lVar4 = 9; lVar4 != 0; lVar4 = lVar4 + -1) {
        *pqVar7 = *pqVar5;
        pqVar5 = pqVar5 + 1;
        pqVar7 = pqVar7 + 1;
      }
      local_88._72_2_ = local_88._72_2_ & 0xfc00;
      QGraphicsItemPrivate::combineTransformFromParent(this_00,&local_88,(QTransform *)0x0);
LAB_005eb6d7:
      QTransform::inverted((bool *)__return_storage_ptr__);
      goto LAB_005eb6df;
    }
    if (pQVar1->parent == this_00->parent) {
      if ((pQVar1->transformData == (TransformData *)0x0) &&
         (this_00->transformData == (TransformData *)0x0)) {
        dVar10 = (pQVar1->pos).xp - (this_00->pos).xp;
        dVar11 = (pQVar1->pos).yp - (this_00->pos).yp;
        if (ok != (bool *)0x0) {
          *ok = true;
        }
        if (*(long *)(in_FS_OFFSET + 0x28) == local_38) goto LAB_005eb649;
        goto LAB_005eb76b;
      }
      pQVar6 = &local_88;
      pqVar5 = (qreal *)&DAT_00700eb8;
      pQVar8 = pQVar6;
      for (lVar4 = 10; lVar4 != 0; lVar4 = lVar4 + -1) {
        pQVar8->m_matrix[0][0] = *pqVar5;
        pqVar5 = pqVar5 + 1;
        pQVar8 = (QTransform *)(pQVar8->m_matrix[0] + 1);
      }
      pqVar5 = (qreal *)&DAT_00700e28;
      pQVar8 = pQVar6;
      for (lVar4 = 9; lVar4 != 0; lVar4 = lVar4 + -1) {
        pQVar8->m_matrix[0][0] = *pqVar5;
        pqVar5 = pqVar5 + 1;
        pQVar8 = (QTransform *)(pQVar8->m_matrix[0] + 1);
      }
      local_88._72_2_ = local_88._72_2_ & 0xfc00;
      QGraphicsItemPrivate::combineTransformFromParent(pQVar1,pQVar6,(QTransform *)0x0);
      pqVar5 = (qreal *)&DAT_00700eb8;
      pQVar8 = &local_d8;
      for (lVar4 = 10; lVar4 != 0; lVar4 = lVar4 + -1) {
        pQVar8->m_matrix[0][0] = *pqVar5;
        pqVar5 = pqVar5 + (ulong)bVar9 * -2 + 1;
        pQVar8 = (QTransform *)((long)pQVar8 + ((ulong)bVar9 * -2 + 1) * 8);
      }
      pqVar5 = (qreal *)&DAT_00700e28;
      pQVar8 = &local_d8;
      for (lVar4 = 9; lVar4 != 0; lVar4 = lVar4 + -1) {
        pQVar8->m_matrix[0][0] = *pqVar5;
        pqVar5 = pqVar5 + (ulong)bVar9 * -2 + 1;
        pQVar8 = (QTransform *)((long)pQVar8 + ((ulong)bVar9 * -2 + 1) * 8);
      }
      local_d8._72_2_ = local_d8._72_2_ & 0xfc00;
      QGraphicsItemPrivate::combineTransformFromParent((other->d_ptr).d,&local_d8,(QTransform *)0x0)
      ;
      pQVar8 = &local_128;
LAB_005eb5f4:
      QTransform::inverted((bool *)pQVar8);
    }
    else {
      pQVar3 = commonAncestorItem(this,other);
      if (pQVar3 == (QGraphicsItem *)0x0) {
        pQVar1 = (this->d_ptr).d;
        local_88.m_matrix[0][0] = (qreal)pQVar1->q_ptr;
        QGraphicsItemPrivate::ensureSceneTransformRecursive(pQVar1,(QGraphicsItem **)&local_88);
        pQVar1 = (other->d_ptr).d;
        local_88.m_matrix[0][0] = (qreal)pQVar1->q_ptr;
        QGraphicsItemPrivate::ensureSceneTransformRecursive(pQVar1,(QGraphicsItem **)&local_88);
        pQVar6 = &((this->d_ptr).d)->sceneTransform;
        pQVar8 = &local_88;
        goto LAB_005eb5f4;
      }
      if (pQVar3 == this || pQVar3 == other) {
        bVar2 = isAncestorOf(this,other);
        pQVar3 = other;
        if (bVar2) {
          pQVar3 = this;
          this = other;
        }
        pqVar5 = (qreal *)&DAT_00700eb8;
        pQVar6 = &local_88;
        for (lVar4 = 10; lVar4 != 0; lVar4 = lVar4 + -1) {
          pQVar6->m_matrix[0][0] = *pqVar5;
          pqVar5 = pqVar5 + (ulong)bVar9 * -2 + 1;
          pQVar6 = (QTransform *)((long)pQVar6 + ((ulong)bVar9 * -2 + 1) * 8);
        }
        pqVar5 = (qreal *)&DAT_00700e28;
        pQVar6 = &local_88;
        for (lVar4 = 9; lVar4 != 0; lVar4 = lVar4 + -1) {
          pQVar6->m_matrix[0][0] = *pqVar5;
          pqVar5 = pqVar5 + (ulong)bVar9 * -2 + 1;
          pQVar6 = (QTransform *)((long)pQVar6 + ((ulong)bVar9 * -2 + 1) * 8);
        }
        local_88._72_2_ = local_88._72_2_ & 0xfc00;
        do {
          QGraphicsItemPrivate::combineTransformToParent
                    ((this->d_ptr).d,&local_88,(QTransform *)0x0);
          this = ((this->d_ptr).d)->parent;
          if (this == (QGraphicsItem *)0x0) break;
        } while (this != pQVar3);
        if (!bVar2) {
          if (ok != (bool *)0x0) {
            *ok = true;
          }
          pQVar6 = &local_88;
          pQVar8 = __return_storage_ptr__;
          for (lVar4 = 10; lVar4 != 0; lVar4 = lVar4 + -1) {
            pQVar8->m_matrix[0][0] = pQVar6->m_matrix[0][0];
            pQVar6 = (QTransform *)((long)pQVar6 + ((ulong)bVar9 * -2 + 1) * 8);
            pQVar8 = (QTransform *)((long)pQVar8 + ((ulong)bVar9 * -2 + 1) * 8);
          }
          goto LAB_005eb6df;
        }
        goto LAB_005eb6d7;
      }
      local_129 = false;
      pqVar5 = (qreal *)&DAT_00700eb8;
      pQVar6 = &local_88;
      for (lVar4 = 10; lVar4 != 0; lVar4 = lVar4 + -1) {
        pQVar6->m_matrix[0][0] = *pqVar5;
        pqVar5 = pqVar5 + (ulong)bVar9 * -2 + 1;
        pQVar6 = (QTransform *)((long)pQVar6 + ((ulong)bVar9 * -2 + 1) * 8);
      }
      itemTransform(&local_88,this,pQVar3,&local_129);
      pqVar5 = (qreal *)&DAT_00700eb8;
      pQVar6 = &local_d8;
      for (lVar4 = 10; lVar4 != 0; lVar4 = lVar4 + -1) {
        pQVar6->m_matrix[0][0] = *pqVar5;
        pqVar5 = pqVar5 + (ulong)bVar9 * -2 + 1;
        pQVar6 = (QTransform *)((long)pQVar6 + ((ulong)bVar9 * -2 + 1) * 8);
      }
      if (local_129 == true) {
        itemTransform(&local_128,other,pQVar3,&local_129);
        pQVar6 = &local_128;
        pQVar8 = &local_d8;
        for (lVar4 = 9; lVar4 != 0; lVar4 = lVar4 + -1) {
          pQVar8->m_matrix[0][0] = pQVar6->m_matrix[0][0];
          pQVar6 = (QTransform *)((long)pQVar6 + ((ulong)bVar9 * -2 + 1) * 8);
          pQVar8 = (QTransform *)((long)pQVar8 + ((ulong)bVar9 * -2 + 1) * 8);
        }
        local_d8._72_2_ = local_128._72_2_;
      }
      if (local_129 == false) {
        if (ok != (bool *)0x0) {
          *ok = false;
        }
        goto LAB_005eb419;
      }
      QTransform::inverted((bool *)&local_128);
      pQVar6 = &local_88;
    }
    QTransform::operator*(__return_storage_ptr__,pQVar6);
  }
LAB_005eb6df:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
LAB_005eb76b:
  __stack_chk_fail();
}

Assistant:

QTransform QGraphicsItem::itemTransform(const QGraphicsItem *other, bool *ok) const
{
    // Catch simple cases first.
    if (other == nullptr) {
        qWarning("QGraphicsItem::itemTransform: null pointer passed");
        return QTransform();
    }
    if (other == this) {
        if (ok)
            *ok = true;
        return QTransform();
    }

    QGraphicsItem *parent = d_ptr->parent;
    const QGraphicsItem *otherParent = other->d_ptr->parent;

    // This is other's child
    if (parent == other) {
        if (ok)
            *ok = true;
        QTransform x;
        d_ptr->combineTransformFromParent(&x);
        return x;
    }

    // This is other's parent
    if (otherParent == this) {
        const QPointF &otherPos = other->d_ptr->pos;
        if (other->d_ptr->transformData) {
            QTransform otherToParent;
            other->d_ptr->combineTransformFromParent(&otherToParent);
            return otherToParent.inverted(ok);
        }
        if (ok)
            *ok = true;
        return QTransform::fromTranslate(-otherPos.x(), -otherPos.y());
    }

    // Siblings
    if (parent == otherParent) {
        // COMBINE
        const QPointF &itemPos = d_ptr->pos;
        const QPointF &otherPos = other->d_ptr->pos;
        if (!d_ptr->transformData && !other->d_ptr->transformData) {
            QPointF delta = itemPos - otherPos;
            if (ok)
                *ok = true;
            return QTransform::fromTranslate(delta.x(), delta.y());
        }

        QTransform itemToParent;
        d_ptr->combineTransformFromParent(&itemToParent);
        QTransform otherToParent;
        other->d_ptr->combineTransformFromParent(&otherToParent);
        return itemToParent * otherToParent.inverted(ok);
    }

    // Find the closest common ancestor. If the two items don't share an
    // ancestor, then the only way is to combine their scene transforms.
    const QGraphicsItem *commonAncestor = commonAncestorItem(other);
    if (!commonAncestor) {
        d_ptr->ensureSceneTransform();
        other->d_ptr->ensureSceneTransform();
        return d_ptr->sceneTransform * other->d_ptr->sceneTransform.inverted(ok);
    }

    // If the two items are cousins (in sibling branches), map both to the
    // common ancestor, and combine the two transforms.
    bool cousins = other != commonAncestor && this != commonAncestor;
    if (cousins) {
        bool good = false;
        QTransform thisToScene = itemTransform(commonAncestor, &good);
        QTransform otherToScene(Qt::Uninitialized);
        if (good)
            otherToScene = other->itemTransform(commonAncestor, &good);
        if (!good) {
            if (ok)
                *ok = false;
            return QTransform();
        }
        return thisToScene * otherToScene.inverted(ok);
    }

    // One is an ancestor of the other; walk the chain.
    bool parentOfOther = isAncestorOf(other);
    const QGraphicsItem *child = parentOfOther ? other : this;
    const QGraphicsItem *root = parentOfOther ? this : other;

    QTransform x;
    const QGraphicsItem *p = child;
    do {
        p->d_ptr.data()->combineTransformToParent(&x);
    } while ((p = p->d_ptr->parent) && p != root);
    if (parentOfOther)
        return x.inverted(ok);
    if (ok)
        *ok = true;
    return x;
}